

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

void __thiscall QCss::Declaration::brushValues(Declaration *this,QBrush *c,QPalette *pal)

{
  _Head_base<0UL,_QBrushData_*,_false> _Var1;
  DeclarationData *pDVar2;
  int iVar3;
  ColorRole cr;
  P _a;
  undefined8 uVar4;
  QColor *pQVar5;
  QBrush *pQVar6;
  P _a_1;
  undefined1 *puVar7;
  undefined1 *puVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  long in_FS_OFFSET;
  int local_8c;
  undefined1 *local_88;
  undefined1 auStack_80 [8];
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(ulong *)&(((this->d).d.ptr)->parsed).d.field_0x18 < 4) {
    uVar11 = 0x1f;
LAB_0053fb15:
    local_78.d.data._16_8_ = 0;
    local_78.d.data.shared = (PrivateShared *)0x0;
    local_78.d.data._8_8_ = 0;
    lVar9 = 0;
    puVar8 = (undefined1 *)0x0;
    pQVar6 = c;
    while( true ) {
      pDVar2 = (this->d).d.ptr;
      puVar7 = (undefined1 *)(pDVar2->values).d.size;
      if ((undefined1 *)0x3 < puVar7) {
        puVar7 = (undefined1 *)0x4;
      }
      if (puVar7 <= puVar8) break;
      if ((uVar11 >> ((uint)puVar8 & 0x1f) & 1) != 0) {
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        auStack_80 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        parseBrushValue((Value *)&local_88,
                        (QPalette *)((long)&((pDVar2->values).d.ptr)->type + lVar9));
        if (auStack_80._4_4_ == 3) {
          local_58.shared = (PrivateShared *)0x0;
          local_58._8_8_ = (undefined1 *)0x0;
          local_58._16_8_ = (undefined1 *)0x0;
          local_40 = 2;
LAB_0053fbfe:
          QList<QVariant>::emplaceBack<QVariant>
                    ((QList<QVariant> *)(auStack_80 + 8),(QVariant *)&local_58);
          ::QVariant::~QVariant((QVariant *)&local_58);
          QBrush::operator=(pQVar6,(QBrush *)&local_88);
        }
        else {
          if (auStack_80._4_4_ != 2) {
            ::QVariant::fromValue<QBrush>
                      ((enable_if_t<std::is_copy_constructible_v<QBrush>_&&_std::is_destructible_v<QBrush>,_QVariant>
                        *)&local_58,(QBrush *)&local_88);
            goto LAB_0053fbfe;
          }
          local_8c = auStack_80._0_4_;
          ::QVariant::fromValue<int,_true>
                    ((enable_if_t<std::conjunction_v<std::is_copy_constructible<int>,_std::is_destructible<int>_>,_QVariant>
                      *)&local_58,&local_8c);
          QList<QVariant>::emplaceBack<QVariant>
                    ((QList<QVariant> *)(auStack_80 + 8),(QVariant *)&local_58);
          ::QVariant::~QVariant((QVariant *)&local_58);
          pQVar5 = QPalette::color(pal,auStack_80._0_4_);
          QBrush::operator=(pQVar6,*pQVar5);
        }
        QBrush::~QBrush((QBrush *)&local_88);
      }
      puVar8 = puVar8 + 1;
      pQVar6 = pQVar6 + 1;
      lVar9 = lVar9 + 0x28;
    }
    if ((uVar11 & 0x10) != 0) {
      ::QVariant::QVariant((QVariant *)&local_58,(QList_conflict1 *)(auStack_80 + 8));
      ::QVariant::operator=(&((this->d).d.ptr)->parsed,(QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)(auStack_80 + 8))
    ;
  }
  else {
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toList();
    lVar10 = 0;
    lVar9 = 0;
    puVar8 = (undefined1 *)0x0;
    uVar11 = 0;
    while( true ) {
      uVar4 = local_58._16_8_;
      if ((undefined1 *)0x3 < (ulong)local_58._16_8_) {
        uVar4 = (undefined1 *)0x4;
      }
      if ((ulong)uVar4 <= puVar8) break;
      iVar3 = ::QVariant::typeId((QVariant *)(local_58._8_8_ + lVar10));
      if (iVar3 == 0x1002) {
        qvariant_cast<QBrush>((QVariant *)(auStack_80 + 8));
        _Var1._M_head_impl =
             c[(long)puVar8].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t
             .super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        c[(long)puVar8].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (QBrushData *)local_78.d.data.shared;
        local_78.d.data.shared = (PrivateShared *)_Var1._M_head_impl;
        QBrush::~QBrush((QBrush *)(auStack_80 + 8));
      }
      else {
        iVar3 = ::QVariant::typeId((QVariant *)(local_58._8_8_ + lVar10));
        if (iVar3 == 2) {
          cr = ::QVariant::toInt((bool *)(local_58._8_8_ + lVar10));
          pQVar5 = QPalette::color(pal,cr);
          QBrush::operator=((QBrush *)
                            ((long)&(c->d)._M_t.
                                    super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t
                                    .super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + lVar9)
                            ,*pQVar5);
        }
        else {
          uVar11 = uVar11 | 1 << ((uint)puVar8 & 0x1f);
        }
      }
      puVar8 = puVar8 + 1;
      lVar9 = lVar9 + 8;
      lVar10 = lVar10 + 0x20;
    }
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_58);
    if (uVar11 != 0) goto LAB_0053fb15;
  }
  switch((ulong)puVar8 & 0xffffffff) {
  case 0:
    QBrush::QBrush((QBrush *)&local_58.shared);
    _Var1._M_head_impl =
         c[3].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
    c[3].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_58.shared;
    local_58.shared = (PrivateShared *)_Var1._M_head_impl;
    pQVar6 = QBrush::operator=(c + 2,c + 3);
    pQVar6 = QBrush::operator=(c + 1,pQVar6);
    QBrush::operator=(c,pQVar6);
    QBrush::~QBrush((QBrush *)&local_58.shared);
    goto switchD_0053fc8f_default;
  case 1:
    pQVar6 = QBrush::operator=(c + 1,c);
    pQVar6 = QBrush::operator=(c + 2,pQVar6);
    break;
  case 2:
    QBrush::operator=(c + 2,c);
    pQVar6 = c + 1;
    break;
  case 3:
    pQVar6 = c + 1;
    break;
  default:
    goto switchD_0053fc8f_default;
  }
  QBrush::operator=(c + 3,pQVar6);
switchD_0053fc8f_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Declaration::brushValues(QBrush *c, const QPalette &pal) const
{
    int needParse = 0x1f; // bits 0..3 say if we should parse the corresponding value.
                          // the bit 4 say we need to update d->parsed
    int i = 0;
    if (d->parsed.isValid()) {
        needParse = 0;
        Q_ASSERT(d->parsed.metaType() == QMetaType::fromType<QList<QVariant>>());
        QList<QVariant> v = d->parsed.toList();
        for (i = 0; i < qMin(v.size(), 4); i++) {
            if (v.at(i).userType() == QMetaType::QBrush) {
                c[i] = qvariant_cast<QBrush>(v.at(i));
            } else if (v.at(i).userType() == QMetaType::Int) {
                c[i] = pal.color((QPalette::ColorRole)(v.at(i).toInt()));
            } else {
                needParse |= (1<<i);
            }
        }
    }
    if (needParse != 0) {
        QList<QVariant> v;
        for (i = 0; i < qMin(d->values.size(), 4); i++) {
            if (!(needParse & (1<<i)))
                continue;
            BrushData data = parseBrushValue(d->values.at(i), pal);
            if (data.type == BrushData::Role) {
                v += QVariant::fromValue<int>(data.role);
                c[i] = pal.color((QPalette::ColorRole)(data.role));
            } else {
                if (data.type != BrushData::DependsOnThePalette) {
                    v += QVariant::fromValue<QBrush>(data.brush);
                } else {
                    v += QVariant();
                }
                c[i] = data.brush;
            }
        }
        if (needParse & 0x10)
            d->parsed = v;
    }
    if (i == 0) c[0] = c[1] = c[2] = c[3] = QBrush();
    else if (i == 1) c[3] = c[2] = c[1] = c[0];
    else if (i == 2) c[2] = c[0], c[3] = c[1];
    else if (i == 3) c[3] = c[1];
}